

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O2

void __thiscall
duckdb::BaseFileReader::AddVirtualColumn(BaseFileReader *this,column_t virtual_column_id)

{
  InternalException *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Reader %s does not support AddVirtualColumn",&local_59);
  (*this->_vptr_BaseFileReader[2])(&local_58,this);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void AddVirtualColumn(column_t virtual_column_id) {
		throw InternalException("Reader %s does not support AddVirtualColumn", GetReaderType());
	}